

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void __thiscall
duckdb::BitpackingCompressionState<int,_true,_int>::Append
          (BitpackingCompressionState<int,_true,_int> *this,UnifiedVectorFormat *vdata,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  ulong uVar5;
  bool is_valid;
  
  if (count != 0) {
    pdVar1 = vdata->data;
    uVar5 = 0;
    do {
      psVar2 = vdata->sel->sel_vector;
      uVar4 = uVar5;
      if (psVar2 != (sel_t *)0x0) {
        uVar4 = (ulong)psVar2[uVar5];
      }
      puVar3 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar3 == (unsigned_long *)0x0) {
        is_valid = true;
      }
      else {
        is_valid = (puVar3[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0;
      }
      BitpackingState<int,int>::
      Update<duckdb::BitpackingCompressionState<int,true,int>::BitpackingWriter>
                ((BitpackingState<int,int> *)&this->state,*(int *)(pdVar1 + uVar4 * 4),is_valid);
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);

		for (idx_t i = 0; i < count; i++) {
			idx_t idx = vdata.sel->get_index(i);
			state.template Update<BitpackingCompressionState<T, WRITE_STATISTICS, T_S>::BitpackingWriter>(
			    data[idx], vdata.validity.RowIsValid(idx));
		}
	}